

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O0

void __thiscall csm::Plugin::Plugin(Plugin *this)

{
  list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *this_00;
  Impl *impl;
  Plugin *local_20;
  Locker local_18;
  Locker locker;
  Plugin *this_local;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_001647c0;
  locker.theImpl = (Impl *)this;
  if (theList_abi_cxx11_ == (list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)0x0)
  {
    this_00 = (list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::__cxx11::list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_>::list(this_00);
    theList_abi_cxx11_ = this_00;
  }
  if (theList_abi_cxx11_ != (list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_> *)0x0)
  {
    impl = Plugin::impl();
    Impl::Locker::Locker(&local_18,impl);
    local_20 = this;
    std::__cxx11::list<const_csm::Plugin_*,_std::allocator<const_csm::Plugin_*>_>::push_back
              (theList_abi_cxx11_,&local_20);
    Impl::Locker::~Locker(&local_18);
  }
  return;
}

Assistant:

Plugin::Plugin()
{
   //---
   // If the list of registered sensor model factories does not exist yet, then
   // create it.
   //---
   if (!theList) theList = new PluginList();

   //---
   // If the list of registered sensor model factories exists now (i.e., no
   // error occurred while creating it), then register the plugin factory in
   // theList by adding a pointer to this list.
   //    The pointer points to the static instance of the derived sensor
   // model plugin.
   //---
   if (theList)
   {
      Impl::Locker locker(impl());

      theList->push_back(this);
   }
}